

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.cpp
# Opt level: O0

TSpirvTypeParameters * __thiscall
glslang::TParseContext::makeSpirvTypeParameters
          (TParseContext *this,TSourceLoc *loc,TIntermConstantUnion *constant)

{
  TIntermConstantUnion *pTVar1;
  int iVar2;
  vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
  *pvVar3;
  TType *this_00;
  char *pcVar4;
  TSpirvTypeParameter local_38;
  vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
  *local_28;
  TSpirvTypeParameters *spirvTypeParams;
  TIntermConstantUnion *constant_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  spirvTypeParams = (TSpirvTypeParameters *)constant;
  constant_local = (TIntermConstantUnion *)loc;
  loc_local = (TSourceLoc *)this;
  pvVar3 = (vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
            *)TVector<glslang::TSpirvTypeParameter>::operator_new
                        ((TVector<glslang::TSpirvTypeParameter> *)0x20,(size_t)loc);
  TVector<glslang::TSpirvTypeParameter>::TVector((TVector<glslang::TSpirvTypeParameter> *)pvVar3);
  local_28 = pvVar3;
  iVar2 = (*(code *)(spirvTypeParams->
                    super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                    ).
                    super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                    ._M_impl.super__Tp_alloc_type.allocator[2].stack.
                    super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                    ._M_impl.super__Vector_impl_data._M_finish)();
  if ((((iVar2 != 1) &&
       (iVar2 = (*(code *)(spirvTypeParams->
                          super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                          ).
                          super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                          ._M_impl.super__Tp_alloc_type.allocator[2].stack.
                          super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                          ._M_impl.super__Vector_impl_data._M_finish)(), iVar2 != 8)) &&
      (iVar2 = (*(code *)(spirvTypeParams->
                         super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                         ).
                         super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                         ._M_impl.super__Tp_alloc_type.allocator[2].stack.
                         super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                         ._M_impl.super__Vector_impl_data._M_finish)(), iVar2 != 9)) &&
     ((iVar2 = (*(code *)(spirvTypeParams->
                         super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                         ).
                         super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                         ._M_impl.super__Tp_alloc_type.allocator[2].stack.
                         super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                         ._M_impl.super__Vector_impl_data._M_finish)(), iVar2 != 0xc &&
      (iVar2 = (*(code *)(spirvTypeParams->
                         super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                         ).
                         super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                         ._M_impl.super__Tp_alloc_type.allocator[2].stack.
                         super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                         ._M_impl.super__Vector_impl_data._M_finish)(), pTVar1 = constant_local,
      iVar2 != 0x1b)))) {
    this_00 = (TType *)(*(code *)(spirvTypeParams->
                                 super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                                 ).
                                 super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                                 ._M_impl.super__Tp_alloc_type.allocator[2].inUseList)();
    pcVar4 = TType::getBasicString(this_00);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar1,"this type not allowed",pcVar4,"");
    return (TSpirvTypeParameters *)local_28;
  }
  pvVar3 = local_28;
  TSpirvTypeParameter::TSpirvTypeParameter(&local_38,(TIntermConstantUnion *)spirvTypeParams);
  std::vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
  ::push_back(pvVar3,&local_38);
  return (TSpirvTypeParameters *)local_28;
}

Assistant:

TSpirvTypeParameters* TParseContext::makeSpirvTypeParameters(const TSourceLoc& loc, const TIntermConstantUnion* constant)
{
    TSpirvTypeParameters* spirvTypeParams = new TSpirvTypeParameters;
    if (constant->getBasicType() != EbtFloat &&
        constant->getBasicType() != EbtInt &&
        constant->getBasicType() != EbtUint &&
        constant->getBasicType() != EbtBool &&
        constant->getBasicType() != EbtString)
        error(loc, "this type not allowed", constant->getType().getBasicString(), "");
    else
        spirvTypeParams->push_back(TSpirvTypeParameter(constant));

    return spirvTypeParams;
}